

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

int glfwUpdateGamepadMappings(char *string)

{
  undefined1 *puVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined1 uVar10;
  int iVar11;
  ushort **ppuVar12;
  size_t sVar13;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  _GLFWmapping *p_Var17;
  char cVar18;
  char *__s1;
  long lVar19;
  char *pcVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  _GLFWmapping mapping;
  char line [1024];
  char *local_678;
  ushort **local_670;
  byte local_663 [128];
  undefined8 local_5e3;
  undefined8 uStack_5db;
  undefined8 local_5d3;
  undefined8 uStack_5cb;
  undefined1 local_5c2 [2];
  undefined1 local_5c0 [2];
  undefined1 local_5be [2];
  undefined1 local_5bc [2];
  undefined1 local_5ba [2];
  undefined1 local_5b8 [2];
  undefined1 local_5b6 [2];
  undefined1 local_5b4 [2];
  undefined1 local_5b2 [2];
  undefined1 local_5b0 [2];
  undefined1 local_5ae [2];
  undefined1 local_5ac [2];
  undefined1 local_5aa [2];
  undefined1 local_5a8 [2];
  undefined1 local_5a6 [2];
  undefined1 local_5a4 [2];
  undefined1 local_5a2 [2];
  undefined8 local_5a0;
  char *local_598 [33];
  long local_490;
  char *local_488;
  long local_480;
  char *local_478;
  undefined1 *local_470;
  char *local_468;
  undefined1 *local_460;
  char *local_458;
  undefined8 *local_450;
  char *local_448;
  long local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  char local_418;
  char local_417 [999];
  
  if (string == (char *)0x0) {
    __assert_fail("string != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dilevin[P]computer-graphics-shader-pipeline/glfw/src/input.c"
                  ,0x41e,"int glfwUpdateGamepadMappings(const char *)");
  }
  if (_glfw.initialized == 0) {
    iVar11 = 0;
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    cVar18 = *string;
    if (cVar18 != '\0') {
      ppuVar12 = __ctype_b_loc();
      local_670 = ppuVar12;
      do {
        if ((*(byte *)((long)*ppuVar12 + (long)cVar18 * 2 + 1) & 0x10) == 0) {
          sVar13 = strcspn(string,"\r\n");
          sVar14 = strspn(string + sVar13,"\r\n");
          string = string + sVar13 + sVar14;
        }
        else {
          sVar13 = strcspn(string,"\r\n");
          if (sVar13 < 0x400) {
            memset(local_663,0,0xcb);
            memcpy(&local_438,string,sVar13);
            *(undefined1 *)((long)&local_438 + sVar13) = 0;
            local_598[0] = "platform";
            local_598[1] = (char *)0x0;
            local_598[2] = "a";
            local_598[3] = local_5c2;
            local_598[4] = "b";
            local_598[5] = local_5c0;
            local_598[6] = "x";
            local_598[7] = local_5be;
            local_598[8] = "y";
            local_598[9] = local_5bc;
            local_598[10] = "back";
            local_598[0xb] = local_5b6;
            local_598[0xc] = "start";
            local_598[0xd] = local_5b4;
            local_598[0xe] = "guide";
            local_598[0xf] = local_5b2;
            local_598[0x10] = "leftshoulder";
            local_598[0x11] = local_5ba;
            local_598[0x12] = "rightshoulder";
            local_598[0x13] = local_5b8;
            local_598[0x14] = "leftstick";
            local_598[0x15] = local_5b0;
            local_598[0x16] = "rightstick";
            local_598[0x17] = local_5ae;
            local_598[0x18] = "dpup";
            local_598[0x19] = local_5ac;
            local_598[0x1a] = "dpright";
            local_598[0x1b] = local_5aa;
            local_598[0x1c] = "dpdown";
            local_598[0x1d] = local_5a8;
            local_598[0x1e] = "dpleft";
            local_598[0x1f] = local_5a6;
            local_598[0x20] = "lefttrigger";
            local_490 = (long)&local_5a0 + 4;
            local_488 = "righttrigger";
            local_480 = (long)&local_5a0 + 6;
            local_478 = "leftx";
            local_470 = local_5a4;
            local_468 = "lefty";
            local_460 = local_5a2;
            local_458 = "rightx";
            local_450 = &local_5a0;
            local_448 = "righty";
            local_440 = (long)&local_5a0 + 2;
            local_678 = (char *)&local_438;
            sVar14 = strcspn((char *)&local_438,",");
            if ((sVar14 == 0x20) && (local_418 == ',')) {
              local_5d3 = local_428;
              uStack_5cb = uStack_420;
              local_5e3 = local_438;
              uStack_5db = uStack_430;
              sVar14 = strcspn(local_417,",");
              if ((sVar14 < 0x80) && (local_417[sVar14] == ',')) {
                memcpy(local_663,local_417,sVar14);
                __s1 = local_417 + sVar14 + 1;
                cVar18 = local_417[sVar14 + 1];
                ppuVar12 = local_670;
                while (local_678 = __s1, local_670 = ppuVar12, cVar18 != '\0') {
                  lVar19 = 8;
                  do {
                    pcVar20 = *(char **)((long)&local_5a0 + lVar19);
                    sVar14 = strlen(pcVar20);
                    iVar11 = strncmp(__s1,pcVar20,sVar14);
                    if ((iVar11 == 0) && (__s1[sVar14] == ':')) {
                      pcVar20 = __s1 + sVar14 + 1;
                      puVar1 = *(undefined1 **)((long)local_598 + lVar19);
                      local_678 = pcVar20;
                      if (puVar1 == (undefined1 *)0x0) {
                        iVar11 = strncmp(pcVar20,"Linux",5);
                        ppuVar12 = local_670;
                        if (iVar11 != 0) goto LAB_00133795;
                        break;
                      }
                      cVar18 = *pcVar20;
                      if (cVar18 == 'a') {
                        uVar10 = 1;
LAB_00133754:
                        *puVar1 = uVar10;
                        uVar16 = strtoul(__s1 + sVar14 + 2,&local_678,10);
                        bVar21 = (byte)uVar16;
                      }
                      else {
                        if (cVar18 != 'h') {
                          if (cVar18 == 'b') {
                            uVar10 = 2;
                            goto LAB_00133754;
                          }
                          break;
                        }
                        *puVar1 = 3;
                        uVar16 = strtoul(__s1 + sVar14 + 2,&local_678,10);
                        uVar15 = strtoul(local_678 + 1,&local_678,10);
                        bVar21 = (byte)(uVar16 << 4) | (byte)uVar15;
                      }
                      puVar1[1] = bVar21;
                      pcVar20 = local_678;
                      break;
                    }
                    lVar19 = lVar19 + 0x10;
                    pcVar20 = __s1;
                  } while (lVar19 != 0x168);
                  sVar14 = strcspn(pcVar20,",");
                  pcVar20 = pcVar20 + sVar14;
                  sVar14 = strspn(pcVar20,",");
                  __s1 = pcVar20 + sVar14;
                  ppuVar12 = local_670;
                  cVar18 = pcVar20[sVar14];
                }
                lVar19 = 0x80;
                do {
                  bVar21 = local_663[lVar19] + 0xbf;
                  bVar22 = local_663[lVar19 + 1] + 0xbf;
                  bVar23 = local_663[lVar19 + 2] + 0xbf;
                  bVar24 = local_663[lVar19 + 3] + 0xbf;
                  bVar25 = local_663[lVar19 + 4] + 0xbf;
                  bVar26 = local_663[lVar19 + 5] + 0xbf;
                  bVar27 = local_663[lVar19 + 6] + 0xbf;
                  bVar28 = local_663[lVar19 + 7] + 0xbf;
                  bVar2 = (byte)((5 < bVar21) * '\x05' | (5 >= bVar21) * bVar21) == bVar21;
                  bVar3 = (byte)((5 < bVar22) * '\x05' | (5 >= bVar22) * bVar22) == bVar22;
                  bVar4 = (byte)((5 < bVar23) * '\x05' | (5 >= bVar23) * bVar23) == bVar23;
                  bVar5 = (byte)((5 < bVar24) * '\x05' | (5 >= bVar24) * bVar24) == bVar24;
                  bVar6 = (byte)((5 < bVar25) * '\x05' | (5 >= bVar25) * bVar25) == bVar25;
                  bVar7 = (byte)((5 < bVar26) * '\x05' | (5 >= bVar26) * bVar26) == bVar26;
                  bVar8 = (byte)((5 < bVar27) * '\x05' | (5 >= bVar27) * bVar27) == bVar27;
                  bVar9 = (byte)((5 < bVar28) * '\x05' | (5 >= bVar28) * bVar28) == bVar28;
                  if (bVar2) {
                    local_663[lVar19] = local_663[lVar19] | 0x20;
                  }
                  if (bVar3) {
                    local_663[lVar19 + 1] = local_663[lVar19 + 1] | 0x20;
                  }
                  if (bVar4) {
                    local_663[lVar19 + 2] = local_663[lVar19 + 2] | 0x20;
                  }
                  if (bVar5) {
                    local_663[lVar19 + 3] = local_663[lVar19 + 3] | 0x20;
                  }
                  if (bVar6) {
                    local_663[lVar19 + 4] = local_663[lVar19 + 4] | 0x20;
                  }
                  if (bVar7) {
                    local_663[lVar19 + 5] = local_663[lVar19 + 5] | 0x20;
                  }
                  if (bVar8) {
                    local_663[lVar19 + 6] = local_663[lVar19 + 6] | 0x20;
                  }
                  if (bVar9) {
                    local_663[lVar19 + 7] = local_663[lVar19 + 7] | 0x20;
                  }
                  if (bVar2) {
                    local_663[lVar19 + 8] = local_663[lVar19 + 8] | 0x20;
                  }
                  if (bVar3) {
                    local_663[lVar19 + 9] = local_663[lVar19 + 9] | 0x20;
                  }
                  if (bVar4) {
                    local_663[lVar19 + 10] = local_663[lVar19 + 10] | 0x20;
                  }
                  if (bVar5) {
                    local_663[lVar19 + 0xb] = local_663[lVar19 + 0xb] | 0x20;
                  }
                  if (bVar6) {
                    local_663[lVar19 + 0xc] = local_663[lVar19 + 0xc] | 0x20;
                  }
                  if (bVar7) {
                    local_663[lVar19 + 0xd] = local_663[lVar19 + 0xd] | 0x20;
                  }
                  if (bVar8) {
                    local_663[lVar19 + 0xe] = local_663[lVar19 + 0xe] | 0x20;
                  }
                  if (bVar9) {
                    local_663[lVar19 + 0xf] = local_663[lVar19 + 0xf] | 0x20;
                  }
                  lVar19 = lVar19 + 0x10;
                } while (lVar19 != 0xa0);
                _glfwPlatformUpdateGamepadGUID((char *)&local_5e3);
                p_Var17 = findMapping((char *)&local_5e3);
                if (p_Var17 == (_GLFWmapping *)0x0) {
                  lVar19 = (long)_glfw.mappingCount;
                  _glfw.mappingCount = (int)(lVar19 + 1);
                  _glfw.mappings = (_GLFWmapping *)realloc(_glfw.mappings,(lVar19 + 1) * 0xcb);
                  p_Var17 = _glfw.mappings + (long)_glfw.mappingCount + -1;
                }
                memcpy(p_Var17,local_663,0xcb);
                goto LAB_00133795;
              }
            }
            _glfwInputError(0x10004,(char *)0x0);
            ppuVar12 = local_670;
          }
LAB_00133795:
          string = string + sVar13;
        }
        cVar18 = *string;
      } while (cVar18 != '\0');
    }
    lVar19 = 0;
    do {
      if (*(int *)(_glfw.joysticks[0].guid + lVar19 + -0x48) != 0) {
        p_Var17 = findValidMapping((_GLFWjoystick *)(_glfw.joysticks[0].guid + lVar19 + -0x48));
        *(_GLFWmapping **)(_glfw.joysticks[0].linjs.path + lVar19 + -0xc) = p_Var17;
      }
      lVar19 = lVar19 + 0x1fa0;
    } while (lVar19 != 0x1fa00);
    iVar11 = 1;
  }
  return iVar11;
}

Assistant:

GLFWAPI int glfwUpdateGamepadMappings(const char* string)
{
    int jid;
    const char* c = string;

    assert(string != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    while (*c)
    {
        if (isxdigit(*c))
        {
            char line[1024];

            const size_t length = strcspn(c, "\r\n");
            if (length < sizeof(line))
            {
                _GLFWmapping mapping = {{0}};

                memcpy(line, c, length);
                line[length] = '\0';

                if (parseMapping(&mapping, line))
                {
                    _GLFWmapping* previous = findMapping(mapping.guid);
                    if (previous)
                        *previous = mapping;
                    else
                    {
                        _glfw.mappingCount++;
                        _glfw.mappings =
                            realloc(_glfw.mappings,
                                    sizeof(_GLFWmapping) * _glfw.mappingCount);
                        _glfw.mappings[_glfw.mappingCount - 1] = mapping;
                    }
                }
            }

            c += length;
        }
        else
        {
            c += strcspn(c, "\r\n");
            c += strspn(c, "\r\n");
        }
    }

    for (jid = 0;  jid <= GLFW_JOYSTICK_LAST;  jid++)
    {
        _GLFWjoystick* js = _glfw.joysticks + jid;
        if (js->present)
            js->mapping = findValidMapping(js);
    }

    return GLFW_TRUE;
}